

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Path * __thiscall kj::Path::parent(Path *__return_storage_ptr__,Path *this)

{
  bool bVar1;
  size_t sVar2;
  anon_class_1_0_00000001 local_a9;
  ArrayPtr<kj::String> local_a8;
  Mapper<kj::ArrayPtr<kj::String>_> local_98;
  Array<kj::String> local_88;
  Fault local_60;
  Fault f;
  size_t local_50;
  DebugExpression<unsigned_long> local_48;
  undefined1 local_40 [8];
  DebugComparison<unsigned_long,_int> _kjCondition;
  Path *this_local;
  
  _kjCondition._32_8_ = this;
  local_50 = Array<kj::String>::size(&this->parts);
  local_48 = _::DebugExpressionStart::operator<<((DebugExpressionStart *)&_::MAGIC_ASSERT,&local_50)
  ;
  f.exception._4_4_ = 0;
  _::DebugExpression<unsigned_long>::operator>
            ((DebugComparison<unsigned_long,_int> *)local_40,&local_48,
             (int *)((long)&f.exception + 4));
  bVar1 = _::DebugComparison::operator_cast_to_bool((DebugComparison *)local_40);
  if (!bVar1) {
    _::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[24]>
              (&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x83,FAILED,"parts.size() > 0","_kjCondition,\"root path has no parent\"",
               (DebugComparison<unsigned_long,_int> *)local_40,
               (char (*) [24])"root path has no parent");
    _::Debug::Fault::fatal(&local_60);
  }
  sVar2 = Array<kj::String>::size(&this->parts);
  local_a8 = Array<kj::String>::first(&this->parts,sVar2 - 1);
  _::Mapper<kj::ArrayPtr<kj::String>_>::Mapper(&local_98,&local_a8);
  _::Mapper<kj::ArrayPtr<kj::String>_>::
  operator*<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_filesystem_c__:132:15)>
            (&local_88,&local_98,&local_a9);
  Path(__return_storage_ptr__,&local_88,ALREADY_CHECKED);
  Array<kj::String>::~Array(&local_88);
  return __return_storage_ptr__;
}

Assistant:

Path Path::parent() && {
  KJ_REQUIRE(parts.size() > 0, "root path has no parent");
  return Path(KJ_MAP(p, parts.first(parts.size() - 1)) { return kj::mv(p); }, ALREADY_CHECKED);
}